

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O1

void PrintMapInfo(WebPPicture *pic)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  char *__format;
  ulong uVar9;
  long lVar10;
  long local_60;
  
  if ((pic->extra_info != (uint8_t *)0x0) && (0 < pic->height)) {
    uVar6 = pic->height + 0xfU >> 4;
    iVar2 = pic->width;
    iVar4 = iVar2 + 0x1e;
    if (-1 < iVar2 + 0xf) {
      iVar4 = iVar2 + 0xf;
    }
    uVar3 = pic->extra_info_type;
    uVar7 = iVar4 >> 4;
    uVar5 = 1;
    if (1 < (int)uVar7) {
      uVar5 = (ulong)uVar7;
    }
    if (uVar6 < 2) {
      uVar6 = 1;
    }
    local_60 = 0;
    uVar8 = 0;
    do {
      uVar9 = uVar5;
      lVar10 = local_60;
      if (0 < iVar2) {
        do {
          if (uVar3 == 1) {
            cVar1 = "+."[pic->extra_info[lVar10]];
LAB_00107f71:
            fputc((int)cVar1,_stderr);
          }
          else {
            if (uVar3 == 2) {
              cVar1 = ".-*X"[pic->extra_info[lVar10]];
              goto LAB_00107f71;
            }
            if (uVar3 == 3) {
              __format = "%.2d ";
            }
            else if ((uVar3 & 0xfffffffe) == 6) {
              __format = "%3d ";
            }
            else {
              __format = "0x%.2x ";
            }
            fprintf(_stderr,__format);
          }
          uVar9 = uVar9 - 1;
          lVar10 = lVar10 + 1;
        } while (uVar9 != 0);
      }
      fputc(10,_stderr);
      uVar8 = uVar8 + 1;
      local_60 = local_60 + (ulong)uVar7;
    } while (uVar8 != uVar6);
  }
  return;
}

Assistant:

static void PrintMapInfo(const WebPPicture* const pic) {
  if (pic->extra_info != NULL) {
    const int mb_w = (pic->width + 15) / 16;
    const int mb_h = (pic->height + 15) / 16;
    const int type = pic->extra_info_type;
    int x, y;
    for (y = 0; y < mb_h; ++y) {
      for (x = 0; x < mb_w; ++x) {
        const int c = pic->extra_info[x + y * mb_w];
        if (type == 1) {   // intra4/intra16
          fprintf(stderr, "%c", "+."[c]);
        } else if (type == 2) {    // segments
          fprintf(stderr, "%c", ".-*X"[c]);
        } else if (type == 3) {    // quantizers
          fprintf(stderr, "%.2d ", c);
        } else if (type == 6 || type == 7) {
          fprintf(stderr, "%3d ", c);
        } else {
          fprintf(stderr, "0x%.2x ", c);
        }
      }
      fprintf(stderr, "\n");
    }
  }
}